

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O0

double __thiscall COLLADABU::Math::Quaternion::log(Quaternion *this,double __x)

{
  double *in_RSI;
  int __x_00;
  Quaternion *pQVar1;
  double extraout_XMM0_Qa;
  double dVar2;
  double dVar3;
  double extraout_XMM0_Qa_00;
  Real fCoeff;
  Real fSin;
  Real fAngle_radian;
  Quaternion *kResult;
  
  Quaternion(this,1.0,0.0,0.0,0.0);
  this->w = 0.0;
  pQVar1 = this;
  std::abs((int)this);
  __x_00 = (int)pQVar1;
  if (extraout_XMM0_Qa < 1.0) {
    dVar2 = acos(*in_RSI);
    dVar3 = sin(dVar2);
    std::abs(__x_00);
    if (0.001 <= extraout_XMM0_Qa_00) {
      dVar2 = dVar2 / dVar3;
      this->x = dVar2 * in_RSI[1];
      this->y = dVar2 * in_RSI[2];
      dVar3 = in_RSI[3];
      this->z = dVar2 * dVar3;
      return dVar2 * dVar3;
    }
  }
  this->x = in_RSI[1];
  this->y = in_RSI[2];
  dVar3 = in_RSI[3];
  this->z = dVar3;
  return dVar3;
}

Assistant:

Quaternion Quaternion::log () const
        {
            // If q = cos(A)+sin(A)*(x*i+y*j+z*k) where (x,y,z) is unit length, then
            // log(q) = A*(x*i+y*j+z*k).  If sin(A) is near zero, use log(q) =
            // sin(A)*(x*i+y*j+z*k) since sin(A)/A has limit 1.

            Quaternion kResult;
            kResult.w = 0.0;

            if ( std::abs( w ) < 1.0 )
            {
                Real fAngle_radian ( acos( w ) );
                Real fSin = sin( fAngle_radian );

                if ( std::abs( fSin ) >= ms_fEpsilon )
                {
                    Real fCoeff = fAngle_radian / fSin;
                    kResult.x = fCoeff * x;
                    kResult.y = fCoeff * y;
                    kResult.z = fCoeff * z;
                    return kResult;
                }
            }

            kResult.x = x;
            kResult.y = y;
            kResult.z = z;

            return kResult;
        }